

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rmro(ASMState *as,x86Op xo,Reg rr,Reg rb,int32_t ofs)

{
  MCode *pMVar1;
  int iVar2;
  byte *pbVar3;
  x86Mode mode;
  MCode *p;
  int32_t ofs_local;
  Reg rb_local;
  Reg rr_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_18;
  
  pMVar1 = as->mcp;
  if ((rb & 0x80) == 0) {
    if ((ofs == 0) && ((rb & 7) != 5)) {
      mode._0_1_ = XM_OFS0;
      p = pMVar1;
    }
    else if (ofs == (char)(MCode)ofs) {
      p = pMVar1 + -1;
      pMVar1[-1] = (MCode)ofs;
      mode._0_1_ = XM_OFS8;
    }
    else {
      p = pMVar1 + -4;
      *(int32_t *)p = ofs;
      mode._0_1_ = XM_OFS32;
    }
    rb_local = rb;
    if ((rb & 7) == 4) {
      p[-1] = '$';
      p = p + -1;
    }
  }
  else {
    *(int32_t *)(pMVar1 + -4) = ofs;
    pMVar1[-5] = '%';
    rb_local = 4;
    mode._0_1_ = XM_OFS0;
    p = pMVar1 + -5;
  }
  p[-1] = (undefined1)mode + (char)((rr & 7) << 3) + ((byte)rb_local & 7);
  *(x86Op *)(p + -5) = xo;
  pbVar3 = p + (int)(char)xo;
  iVar2 = (rr >> 1 & 0x104) + 0x40 + (rb_local >> 3 & 1);
  local_18 = pbVar3;
  if (iVar2 != 0x40) {
    rex._0_1_ = (byte)(rr >> 0x10) | (byte)iVar2;
    if ((char)xo == -4) {
      *pbVar3 = (byte)rex;
      rex._0_1_ = (byte)(xo >> 8);
    }
    else if ((xo & 0xffffff) == 0x6600fd) {
      *pbVar3 = (byte)rex;
      rex._0_1_ = 0x66;
    }
    local_18 = pbVar3 + -1;
    pbVar3[-1] = (byte)rex;
  }
  as->mcp = local_18;
  return;
}

Assistant:

static void emit_rmro(ASMState *as, x86Op xo, Reg rr, Reg rb, int32_t ofs)
{
  MCode *p = as->mcp;
  x86Mode mode;
  if (ra_hasreg(rb)) {
    if (ofs == 0 && (rb&7) != RID_EBP) {
      mode = XM_OFS0;
    } else if (checki8(ofs)) {
      *--p = (MCode)ofs;
      mode = XM_OFS8;
    } else {
      p -= 4;
      *(int32_t *)p = ofs;
      mode = XM_OFS32;
    }
    if ((rb&7) == RID_ESP)
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
  } else {
    *(int32_t *)(p-4) = ofs;
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    p -= 5;
    rb = RID_ESP;
#else
    p -= 4;
    rb = RID_EBP;
#endif
    mode = XM_OFS0;
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}